

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewCreateTests.cpp
# Opt level: O2

TestCaseGroup * vkt::api::createBufferViewCreateTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  ostream *poVar2;
  TestNode *pTVar3;
  long lVar4;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferViewTests;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream testDescription;
  ostringstream testName;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"create","BufferView Construction Tests");
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  for (lVar4 = 1;
      pTVar1 = bufferViewTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 0xb9; lVar4 = lVar4 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testDescription);
    poVar2 = std::operator<<((ostream *)&testName,"create_buffer_view_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<((ostream *)&testDescription,"vkBufferView test ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    pTVar1 = bufferViewTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar3 = (TestNode *)operator_new(0x90);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_340,&local_360,"_uniform");
    std::__cxx11::stringbuf::str();
    TestCase::TestCase((TestCase *)pTVar3,testCtx,&local_340,&local_380);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bca890;
    *(int *)&pTVar3[1]._vptr_TestNode = (int)lVar4;
    pTVar3[1].m_testCtx = (TestContext *)0x0;
    pTVar3[1].m_name._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    pTVar3[1].m_name._M_string_length = 0x800000004;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    pTVar1 = bufferViewTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar3 = (TestNode *)operator_new(0x90);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_340,&local_360,"_storage");
    std::__cxx11::stringbuf::str();
    TestCase::TestCase((TestCase *)pTVar3,testCtx,&local_340,&local_380);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bca890;
    *(int *)&pTVar3[1]._vptr_TestNode = (int)lVar4;
    pTVar3[1].m_testCtx = (TestContext *)0x0;
    pTVar3[1].m_name._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    pTVar3[1].m_name._M_string_length = 0x1000000008;
    tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testDescription);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testName);
  }
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&bufferViewTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBufferViewCreateTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "create", "BufferView Construction Tests"));

	const VkDeviceSize range = VK_WHOLE_SIZE;
	for (deUint32 format = VK_FORMAT_UNDEFINED + 1; format < VK_CORE_FORMAT_LAST; format++)
	{
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_view_" << format;
		testDescription << "vkBufferView test " << testName.str();
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_UNIFORM_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_uniform", testDescription.str(), testParams));
		}
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_STORAGE_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_storage", testDescription.str(), testParams));
		}
	}

	return bufferViewTests.release();
}